

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

Varnode * __thiscall
ConditionalExecution::getNewMulti(ConditionalExecution *this,PcodeOp *op,BlockBasic *bl)

{
  Funcdata *this_00;
  Varnode *vn;
  long lVar1;
  PcodeOp *op_00;
  Varnode *pVVar2;
  int4 i;
  int slot;
  Address local_40;
  
  this_00 = this->fd;
  lVar1 = (long)(bl->super_FlowBlock).intothis.
                super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(bl->super_FlowBlock).intothis.
                super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                super__Vector_impl_data._M_start;
  (*(bl->super_FlowBlock)._vptr_FlowBlock[2])(&local_40,bl,lVar1 % 0x18);
  op_00 = Funcdata::newOp(this_00,(int4)(lVar1 / 0x18),&local_40);
  vn = op->output;
  pVVar2 = Funcdata::newUniqueOut(this->fd,vn->size,op_00);
  Funcdata::opSetOpcode(this->fd,op_00,CPUI_MULTIEQUAL);
  for (slot = 0;
      slot < (int)(((long)(bl->super_FlowBlock).intothis.
                          super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(bl->super_FlowBlock).intothis.
                         super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18); slot = slot + 1) {
    Funcdata::opSetInput(this->fd,op_00,vn,slot);
  }
  Funcdata::opInsertBegin(this->fd,op_00,bl);
  return pVVar2;
}

Assistant:

Varnode *ConditionalExecution::getNewMulti(PcodeOp *op,BlockBasic *bl)

{
  PcodeOp *newop = fd->newOp(bl->sizeIn(),bl->getStart());
  Varnode *outvn = op->getOut();
  Varnode *newoutvn;
  // Using the original outvn address may cause merge conflicts
  //  newoutvn = fd->newVarnodeOut(outvn->getSize(),outvn->getAddr(),newop);
  newoutvn = fd->newUniqueOut(outvn->getSize(),newop);
  fd->opSetOpcode(newop,CPUI_MULTIEQUAL);

  // We create NEW references to outvn, these refs will get put
  // at the end of the dependency list and will get handled in
  // due course
  for(int4 i=0;i<bl->sizeIn();++i)
    fd->opSetInput(newop,outvn,i);

  fd->opInsertBegin(newop,bl);
  return newoutvn;
}